

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundAggregateExpression::Deserialize
          (BoundAggregateExpression *this,Deserializer *deserializer)

{
  bool bVar1;
  pointer pBVar2;
  ClientContext *context;
  LogicalType *in_R9;
  AggregateType aggregate_type;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_1b8;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_1a8;
  long *local_1a0;
  undefined1 local_198 [8];
  LogicalType return_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  LogicalType local_160;
  pair<duckdb::AggregateFunction,_duckdb::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>_>
  entry;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  Deserializer::
  ReadProperty<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (&children,deserializer,0xc9,"children");
  LogicalType::LogicalType(&local_160,&return_type);
  FunctionSerializer::Deserialize<duckdb::AggregateFunction,duckdb::AggregateFunctionCatalogEntry>
            (&entry,(FunctionSerializer *)deserializer,(Deserializer *)0x1b,(CatalogType)&children,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_160,in_R9);
  LogicalType::~LogicalType(&local_160);
  aggregate_type =
       Deserializer::ReadProperty<duckdb::AggregateType>(deserializer,0xcb,"aggregate_type");
  local_1a0 = (long *)0x0;
  Deserializer::
  ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)local_198,(field_id_t)deserializer,(char *)0xcc,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x1fe8c50);
  if (local_1a0 != (long *)0x0) {
    (**(code **)(*local_1a0 + 8))();
  }
  local_1a0 = (long *)0x0;
  make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::AggregateType&>
            ((duckdb *)&local_1b8,&entry.first,&children,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_198,&entry.second,&aggregate_type);
  pBVar2 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_1b8);
  bVar1 = LogicalType::operator!=(&(pBVar2->super_Expression).return_type,&return_type);
  if (bVar1) {
    context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
    local_1a8._M_head_impl = local_1b8._M_head_impl;
    local_1b8._M_head_impl = (BoundAggregateExpression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)this,context,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1a8,&return_type,false);
    if (local_1a8._M_head_impl != (BoundAggregateExpression *)0x0) {
      (*((local_1a8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_1a8._M_head_impl = (BoundAggregateExpression *)0x0;
    if (local_1b8._M_head_impl != (BoundAggregateExpression *)0x0) {
      (*((local_1b8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
  }
  else {
    pBVar2 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                           *)&local_1b8);
    local_1b0._M_head_impl = (BoundOrderModifier *)0x0;
    Deserializer::
    ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::BoundOrderModifier,std::default_delete<duckdb::BoundOrderModifier>,true>>
              (deserializer,0xcd,"order_bys",&pBVar2->order_bys,
               (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                *)&local_1b0);
    if (local_1b0._M_head_impl != (BoundOrderModifier *)0x0) {
      (*((local_1b0._M_head_impl)->super_BoundResultModifier)._vptr_BoundResultModifier[1])();
    }
    local_1b0._M_head_impl = (BoundOrderModifier *)0x0;
    (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
         (_func_int **)local_1b8._M_head_impl;
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_198 !=
      (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_198 + 8))();
  }
  ::std::
  pair<duckdb::AggregateFunction,_duckdb::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>_>
  ::~pair(&entry);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&children);
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundAggregateExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto children = deserializer.ReadProperty<vector<unique_ptr<Expression>>>(201, "children");
	auto entry = FunctionSerializer::Deserialize<AggregateFunction, AggregateFunctionCatalogEntry>(
	    deserializer, CatalogType::AGGREGATE_FUNCTION_ENTRY, children, return_type);
	auto aggregate_type = deserializer.ReadProperty<AggregateType>(203, "aggregate_type");
	auto filter =
	    deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(204, "filter", unique_ptr<Expression>());
	auto result = make_uniq<BoundAggregateExpression>(std::move(entry.first), std::move(children), std::move(filter),
	                                                  std::move(entry.second), aggregate_type);
	if (result->return_type != return_type) {
		// return type mismatch - push a cast
		auto &context = deserializer.Get<ClientContext &>();
		return BoundCastExpression::AddCastToType(context, std::move(result), return_type);
	}
	deserializer.ReadPropertyWithExplicitDefault(205, "order_bys", result->order_bys, unique_ptr<BoundOrderModifier>());
	return std::move(result);
}